

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageDrawText(Image *dst,char *text,int posX,int posY,int fontSize,Color color)

{
  undefined1 auVar1 [16];
  Image src;
  Font font;
  Rectangle dstRec;
  Image local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  CharInfo *pCStack_30;
  
  GetFontDefault();
  font.charsPadding = (undefined4)uStack_50;
  font.texture.id = uStack_50._4_4_;
  font.baseSize = (undefined4)local_58;
  font.charsCount = local_58._4_4_;
  font.texture.width = (undefined4)local_48;
  font.texture.height = local_48._4_4_;
  font.texture.mipmaps = (undefined4)uStack_40;
  font.texture.format = uStack_40._4_4_;
  font.recs = (Rectangle *)local_38;
  font.chars = pCStack_30;
  ImageTextEx(&local_70,font,text,(float)fontSize,(float)fontSize / 10.0,color);
  src.height = local_70.height;
  src.width = local_70.width;
  dstRec.y = (float)posY;
  dstRec.x = (float)posX;
  src.data = local_70.data;
  src.mipmaps = local_70.mipmaps;
  src.format = local_70.format;
  auVar1._4_4_ = (float)local_70.height;
  auVar1._0_4_ = (float)local_70.width;
  auVar1._8_8_ = 0;
  dstRec.height = (float)local_70.height;
  dstRec.width = (float)local_70.width;
  ImageDraw(dst,src,(Rectangle)(auVar1 << 0x40),dstRec,(Color)0xffffffff);
  free(local_70.data);
  return;
}

Assistant:

void ImageDrawText(Image *dst, const char *text, int posX, int posY, int fontSize, Color color)
{
    Vector2 position = { (float)posX, (float)posY };

    // NOTE: For default font, sapcing is set to desired font size / default font size (10)
    ImageDrawTextEx(dst, GetFontDefault(), text, position, (float)fontSize, (float)fontSize/10, color);
}